

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O2

void __thiscall xemmai::t_emit::f_join(t_emit *this,t_block *a_junction)

{
  pointer ptVar1;
  t_emit *this_00;
  size_t i;
  ulong __n;
  reference rVar2;
  
  for (__n = 0; __n < (ulong)((long)(a_junction->v_privates).
                                    super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(a_junction->v_privates).
                                    super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2); __n = __n + 1)
  {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[](this->v_privates,__n);
    if ((((*rVar2._M_p & rVar2._M_mask) == 0) &&
        (ptVar1 = (a_junction->v_privates).
                  super__Vector_base<xemmai::ast::t_block::t_private,_std::allocator<xemmai::ast::t_block::t_private>_>
                  ._M_impl.super__Vector_impl_data._M_start, ptVar1[__n].v_use == true)) &&
       (ptVar1[__n].v_in == true)) {
      this_00 = operator<<(this,c_instruction__NUL);
      operator<<(this_00,this->v_arguments + __n);
    }
  }
  return;
}

Assistant:

void t_emit::f_join(const ast::t_block& a_junction)
{
	for (size_t i = 0; i < a_junction.v_privates.size(); ++i) {
		if ((*v_privates)[i]) continue;
		auto& x = a_junction.v_privates[i];
		if (x.v_use && x.v_in) *this << c_instruction__NUL << v_arguments + i;
	}
}